

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O1

void la_cross_call(TCGContext_conflict9 *s,int nt)

{
  uint uVar1;
  uint *puVar2;
  long lVar3;
  uint uVar4;
  
  if (0 < nt) {
    uVar1 = s->tcg_target_call_clobber_regs;
    lVar3 = 0;
    do {
      if ((*(byte *)((long)&s->temps[0].state + lVar3) & 1) == 0) {
        puVar2 = *(uint **)((long)&s->temps[0].state_ptr + lVar3);
        uVar4 = *puVar2 & ~uVar1;
        if (uVar4 == 0) {
          uVar4 = s->tcg_target_available_regs[(byte)(&s->temps[0].field_0x3)[lVar3]] & ~uVar1;
        }
        *puVar2 = uVar4;
      }
      lVar3 = lVar3 + 0x38;
    } while ((ulong)(uint)nt * 0x38 - lVar3 != 0);
  }
  return;
}

Assistant:

static void la_cross_call(TCGContext *s, int nt)
{
    TCGRegSet mask = ~(s->tcg_target_call_clobber_regs);
    int i;

    for (i = 0; i < nt; i++) {
        TCGTemp *ts = &s->temps[i];
        if (!(ts->state & TS_DEAD)) {
            TCGRegSet *pset = la_temp_pref(ts);
            TCGRegSet set = *pset;

            set &= mask;
            /* If the combination is not possible, restart.  */
            if (set == 0) {
                set = s->tcg_target_available_regs[ts->type] & mask;
            }
            *pset = set;
        }
    }
}